

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  char **ppcVar1;
  bool bVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined7 extraout_var;
  char *pcVar5;
  undefined8 s;
  string *s_00;
  string mapProp;
  string locProp;
  string locPropBase;
  string config_upper;
  string impProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string local_f8;
  undefined4 local_d4;
  char **local_d0;
  string local_c8;
  string local_a8;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_88 = &local_78;
  local_80 = 0;
  local_78 = 0;
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_a8,desired_config);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (this->TargetTypeValue == OBJECT_LIBRARY) {
    pcVar5 = "IMPORTED_OBJECTS";
  }
  else if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar5 = "IMPORTED_LIBNAME";
  }
  else {
    pcVar5 = "IMPORTED_LOCATION";
  }
  std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar5);
  std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x50f383);
  std::__cxx11::string::_M_append((char *)suffix,(ulong)local_88);
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = (string *)0x0;
  local_38 = 0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"MAP_IMPORTED_CONFIG_","");
  std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_88);
  pcVar5 = GetProperty(this,&local_f8);
  if (pcVar5 != (char *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar3 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar5,pcVar5 + sVar3);
    cmSystemTools::ExpandListArgument
              (&local_c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  paVar4 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar4) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    paVar4 = extraout_RAX;
  }
  if (this->DLLPlatform == true) {
    local_d4 = (undefined4)CONCAT71((int7)((ulong)paVar4 >> 8),1);
    if (this->TargetTypeValue != SHARED_LIBRARY) {
      bVar2 = IsExecutableWithExports(this);
      local_d4 = (undefined4)CONCAT71(extraout_var,bVar2);
    }
  }
  else {
    local_d4 = 0;
  }
  s = local_48._M_allocated_capacity;
  ppcVar1 = imp;
  if (*loc != (char *)0x0) {
LAB_0020be68:
    bVar2 = true;
    goto LAB_0020be78;
  }
  do {
    local_d0 = ppcVar1;
    ppcVar1 = local_d0;
    pcVar5 = *local_d0;
    if ((pcVar5 != (char *)0x0) || (s == local_48._8_8_)) {
      if (local_48._M_allocated_capacity == local_48._8_8_) {
        if (pcVar5 == (char *)0x0) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(suffix->_M_dataplus)._M_p);
          pcVar5 = GetProperty(this,&local_f8);
          *loc = pcVar5;
          if ((char)local_d4 != '\0') {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"IMPORTED_IMPLIB","");
            std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(suffix->_M_dataplus)._M_p);
            pcVar5 = GetProperty(this,&local_c8);
            *ppcVar1 = pcVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (*loc != (char *)0x0) goto LAB_0020be68;
        }
      }
      else if (pcVar5 == (char *)0x0) {
        bVar2 = this->TargetTypeValue == INTERFACE_LIBRARY;
        goto LAB_0020be78;
      }
      if (*ppcVar1 != (char *)0x0) goto LAB_0020be68;
      suffix->_M_string_length = 0;
      *(suffix->_M_dataplus)._M_p = '\0';
      pcVar5 = GetProperty(this,&local_a8);
      *loc = pcVar5;
      if ((char)local_d4 != '\0') {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"IMPORTED_IMPLIB","");
        pcVar5 = GetProperty(this,&local_f8);
        *ppcVar1 = pcVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = *loc;
      }
      if ((pcVar5 != (char *)0x0) || (*ppcVar1 != (char *)0x0)) goto LAB_0020be68;
      local_68._0_8_ = (string *)0x0;
      local_68._8_8_ = (string *)0x0;
      local_68._16_8_ = 0;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"IMPORTED_CONFIGURATIONS","");
      pcVar5 = GetProperty(this,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        sVar3 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,pcVar5,pcVar5 + sVar3);
        cmSystemTools::ExpandListArgument
                  (&local_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      s_00 = (string *)local_68._0_8_;
      if (*loc == (char *)0x0) goto LAB_0020c2d6;
      goto LAB_0020c418;
    }
    if (((string *)s)->_M_string_length == 0) {
      pcVar5 = GetProperty(this,&local_a8);
      *loc = pcVar5;
      if ((char)local_d4 != '\0') {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"IMPORTED_IMPLIB","");
        pcVar5 = GetProperty(this,&local_f8);
        *local_d0 = pcVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = *loc;
      }
      if ((pcVar5 != (char *)0x0) || (*local_d0 != (char *)0x0)) {
        suffix->_M_string_length = 0;
        *(suffix->_M_dataplus)._M_p = '\0';
      }
    }
    else {
      cmsys::SystemTools::UpperCase(&local_f8,(string *)s);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      std::__cxx11::string::append((char *)&local_c8);
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      pcVar5 = GetProperty(this,&local_c8);
      *loc = pcVar5;
      if ((char)local_d4 != '\0') {
        local_68._0_8_ = local_68 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"IMPORTED_IMPLIB_","");
        std::__cxx11::string::_M_append((char *)local_68,(ulong)local_f8._M_dataplus._M_p);
        pcVar5 = GetProperty(this,(string *)local_68);
        *local_d0 = pcVar5;
        if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        pcVar5 = *loc;
      }
      if ((pcVar5 != (char *)0x0) || (*local_d0 != (char *)0x0)) {
        std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x50f383);
        std::__cxx11::string::_M_append((char *)suffix,(ulong)local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    s = (string *)(s + 0x20);
    ppcVar1 = local_d0;
  } while (*loc == (char *)0x0);
  goto LAB_0020c12f;
  while( true ) {
    std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x50f383);
    cmsys::SystemTools::UpperCase(&local_f8,s_00);
    std::__cxx11::string::_M_append((char *)suffix,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(suffix->_M_dataplus)._M_p);
    pcVar5 = GetProperty(this,&local_f8);
    *loc = pcVar5;
    if ((char)local_d4 != '\0') {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"IMPORTED_IMPLIB","");
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(suffix->_M_dataplus)._M_p);
      pcVar5 = GetProperty(this,&local_c8);
      *local_d0 = pcVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    s_00 = s_00 + 1;
    if (*loc != (char *)0x0) break;
LAB_0020c2d6:
    if ((*local_d0 != (char *)0x0) || (s_00 == (string *)local_68._8_8_)) break;
  }
LAB_0020c418:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  if (*loc == (char *)0x0) {
    bVar2 = true;
    if (*local_d0 == (char *)0x0) {
      bVar2 = this->TargetTypeValue == INTERFACE_LIBRARY;
    }
    goto LAB_0020be78;
  }
LAB_0020c12f:
  bVar2 = true;
LAB_0020be78:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  return bVar2;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc, const char** imp,
                               std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += config_upper;

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = "MAP_IMPORTED_CONFIG_";
    mapProp += config_upper;
    if (const char* mapValue = this->GetProperty(mapProp)) {
      cmSystemTools::ExpandListArgument(mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for (std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
       !*loc && !*imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      *loc = this->GetProperty(locPropBase);
      if (allowImp) {
        *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (*loc || *imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = locPropBase + "_";
      locProp += mcUpper;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB_";
        impProp += mcUpper;
        *imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (*loc || *imp) {
        suffix = "_";
        suffix += mcUpper;
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!*loc && !*imp) {
    std::string locProp = locPropBase;
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!*loc && !*imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty(locPropBase);
    if (allowImp) {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!*loc && !*imp) {
    std::vector<std::string> availableConfigs;
    if (const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
    }
    for (std::vector<std::string>::const_iterator aci =
           availableConfigs.begin();
         !*loc && !*imp && aci != availableConfigs.end(); ++aci) {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = locPropBase;
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}